

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_CCtx local_3c0;
  
  memset(&local_3c0,0,0x390);
  sVar1 = ZSTD_compress_usingDict
                    (&local_3c0,dst,dstCapacity,src,srcSize,(void *)0x0,0,compressionLevel);
  ZSTD_free(local_3c0.workSpace,(ZSTD_customMem)(ZEXT824(0) << 0x40));
  return sVar1;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity, const void* src, size_t srcSize, int compressionLevel)
{
    size_t result;
    ZSTD_CCtx ctxBody;
    memset(&ctxBody, 0, sizeof(ctxBody));
    ctxBody.customMem = ZSTD_defaultCMem;
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_free(ctxBody.workSpace, ZSTD_defaultCMem);  /* can't free ctxBody itself, as it's on stack; free only heap content */
    return result;
}